

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O0

bool __thiscall
COLLADABU::Math::Matrix3::toEulerAnglesYZX
          (Matrix3 *this,Real *rfYAngle_radian,Real *rfPAngle_radian,Real *rfRAngle_radian)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double dVar1;
  Real fRpY_radian;
  Real fRmY_radian;
  bool local_1;
  
  dVar1 = asin(in_RDI[3]);
  *in_RDX = dVar1;
  if (HALF_PI <= *in_RDX) {
    dVar1 = atan2(in_RDI[7],in_RDI[8]);
    *in_RCX = 0.0;
    *in_RSI = dVar1 - *in_RCX;
    local_1 = false;
  }
  else if (*in_RDX <= -HALF_PI) {
    dVar1 = atan2(in_RDI[7],in_RDI[8]);
    *in_RCX = 0.0;
    *in_RSI = *in_RCX - dVar1;
    local_1 = false;
  }
  else {
    dVar1 = atan2(-in_RDI[6],*in_RDI);
    *in_RSI = dVar1;
    dVar1 = atan2(-in_RDI[5],in_RDI[4]);
    *in_RCX = dVar1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Matrix3::toEulerAnglesYZX ( Real& rfYAngle_radian, Real& rfPAngle_radian,
                                         Real& rfRAngle_radian ) const
        {
            // rot =  cy*cz           sx*sy-cx*cy*sz  cx*sy+cy*sx*sz
            //        sz              cx*cz          -cz*sx
            //       -cz*sy           cy*sx+cx*sy*sz  cx*cy-sx*sy*sz

            rfPAngle_radian = asin( m[ 1 ][ 0 ] );

            if ( rfPAngle_radian <  Math::HALF_PI  )
            {
                if ( rfPAngle_radian >  -Math::HALF_PI )
                {
                    rfYAngle_radian = atan2( -m[ 2 ][ 0 ], m[ 0 ][ 0 ] );
                    rfRAngle_radian = atan2( -m[ 1 ][ 2 ], m[ 1 ][ 1 ] );
                    return true;
                }

                else
                {
                    // WARNING.  Not a unique solution.
                    Real fRmY_radian = atan2( m[ 2 ][ 1 ], m[ 2 ][ 2 ] );
                    rfRAngle_radian =  0.0;  // any angle works
                    rfYAngle_radian = rfRAngle_radian - fRmY_radian;
                    return false;
                }
            }

            else
            {
                // WARNING.  Not a unique solution.
                Real fRpY_radian = atan2( m[ 2 ][ 1 ], m[ 2 ][ 2 ] );
                rfRAngle_radian =  0.0;  // any angle works
                rfYAngle_radian = fRpY_radian - rfRAngle_radian;
                return false;
            }
        }